

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testPrimitivesOutside
          (TestStatus *__return_storage_ptr__,Context *context,VkPrimitiveTopology topology)

{
  DrawState *this;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *pTVar2;
  int iVar3;
  MessageBuilder *this_00;
  long lVar4;
  int local_2ec;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  DrawState drawState;
  Vec4 local_268;
  Vector<float,_4> local_258;
  VulkanDrawContext drawContext;
  ConstPixelBufferAccess local_58;
  
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"vert",(allocator<char> *)&vertices);
  drawState.renderSize.m_data =
       (uint  [2])::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  drawState.topology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&drawState);
  std::__cxx11::string::~string((string *)&drawContext);
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"frag",(allocator<char> *)&vertices);
  drawState.renderSize.m_data =
       (uint  [2])::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  drawState.topology = 0x10;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&drawState);
  std::__cxx11::string::~string((string *)&drawContext);
  pTVar2 = context->m_testCtx->m_log;
  this = &drawContext.super_DrawContext.m_drawState;
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,
                  "Drawing primitives outside the clip volume. Expecting an empty image.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&drawContext,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  local_2ec = 0;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
    drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)pTVar2;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&drawContext.super_DrawContext.m_drawState);
    this_00 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&drawContext,
                         (char **)((long)&testPrimitivesOutside::cases[0].desc + lVar4));
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&drawContext.super_DrawContext.m_drawState);
    drawContext.super_DrawContext.m_drawState.topology =
         *(VkPrimitiveTopology *)((long)&testPrimitivesOutside::cases[0].zPos + lVar4);
    drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0x0;
    drawContext.super_DrawContext.m_drawState.colorFormat = VK_FORMAT_UNDEFINED;
    genVertices(&vertices,topology,(Vec4 *)&drawContext,0.0);
    drawutil::DrawState::DrawState(&drawState,topology,0x10,0x10);
    drawCallData.vertices = &vertices;
    vulkanProgram.shaders = &shaders;
    drawutil::VulkanDrawContext::VulkanDrawContext
              (&drawContext,context,&drawState,&drawCallData,&vulkanProgram);
    drawutil::VulkanDrawContext::draw(&drawContext);
    drawutil::VulkanDrawContext::getColorPixels(&local_58,&drawContext);
    local_268.m_data[0] = 0.0;
    local_268.m_data[1] = 0.0;
    local_268.m_data[2] = 0.0;
    local_268.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector(&local_258);
    iVar3 = countPixels(&local_58,&local_268,&local_258);
    local_2ec = local_2ec + (uint)(iVar3 == 0x100);
    drawutil::VulkanDrawContext::~VulkanDrawContext(&drawContext);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  if (local_2ec == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drawContext,"OK",(allocator<char> *)&drawState);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&drawContext);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drawContext,"Rendered image(s) are incorrect",
               (allocator<char> *)&drawState);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&drawContext);
  }
  std::__cxx11::string::~string((string *)&drawContext);
  std::_Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~_Vector_base
            (&shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testPrimitivesOutside (Context& context, const VkPrimitiveTopology topology)
{
	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	tcu::TestLog&	log			= context.getTestContext().getLog();
	int				numPassed	= 0;

	static const struct
	{
		const char* const	desc;
		float				zPos;
	} cases[] =
	{
		{ "Draw primitives in front of the near clipping plane, z < 0.0",	-0.5f, },
		{ "Draw primitives behind the far clipping plane, z > 1.0",			 1.5f, },
	};

	log << tcu::TestLog::Message << "Drawing primitives outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		log << tcu::TestLog::Message << cases[caseNdx].desc << tcu::TestLog::EndMessage;

		const std::vector<Vec4> vertices = genVertices(topology, Vec4(0.0f, 0.0f, cases[caseNdx].zPos, 0.0f), 0.0f);
		DrawState				drawState		(topology, RENDER_SIZE, RENDER_SIZE);
		DrawCallData			drawCallData	(vertices);
		VulkanProgram			vulkanProgram	(shaders);

		VulkanDrawContext		drawContext(context, drawState, drawCallData, vulkanProgram);
		drawContext.draw();

		// All pixels must be black -- nothing is drawn.
		const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
		if (numBlackPixels == NUM_RENDER_PIXELS)
			++numPassed;
	}

	return (numPassed == DE_LENGTH_OF_ARRAY(cases) ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}